

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_DecMarkMffc(Abc_Obj_t *pPivot,int nLevelMin,int nMffcMax,int fVeryVerbose,Vec_Int_t *vMffc,
                    Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,Sfm_Mit_t *pMit)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  Vec_Ptr_t *pVVar9;
  void *pvVar10;
  int iVar11;
  int *__ptr;
  ulong uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar13;
  ulong extraout_RDX_03;
  long lVar14;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  long extraout_RDX_13;
  long extraout_RDX_14;
  long extraout_RDX_15;
  long extraout_RDX_16;
  long extraout_RDX_17;
  long extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong extraout_RDX_23;
  ulong extraout_RDX_24;
  ulong extraout_RDX_25;
  ulong extraout_RDX_26;
  ulong extraout_RDX_27;
  void **extraout_RDX_28;
  void **ppvVar15;
  void **extraout_RDX_29;
  long lVar16;
  long lVar17;
  long lVar18;
  
  uVar13 = (ulong)(uint)nMffcMax;
  if (nMffcMax < 1) {
    __assert_fail("nMffcMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x5aa,
                  "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  iVar11 = pPivot->Id;
  __ptr = vMffc->pArray;
  if (vMffc->nCap < 1) {
    if (__ptr == (int *)0x0) {
      __ptr = (int *)malloc(4);
      uVar13 = extraout_RDX_00;
    }
    else {
      __ptr = (int *)realloc(__ptr,4);
      uVar13 = extraout_RDX;
    }
    vMffc->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMffc->nCap = 1;
  }
  *__ptr = iVar11;
  vMffc->nSize = 1;
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim == (Sfm_Tim_t *)0x0) {
      if (0 < (pPivot->vFanins).nSize) {
        lVar17 = 0;
        do {
          plVar6 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
          if (((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) && (*(int *)((long)plVar6 + 0x2c) == 1))
          {
            lVar14 = *plVar6;
            iVar11 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar11 + 1,(int)uVar13);
            if (((long)iVar11 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar11)) goto LAB_004bab9c;
            uVar13 = extraout_RDX_19;
            if ((*(int *)(*(long *)(lVar14 + 0xe8) + (long)iVar11 * 4) == *(int *)(*plVar6 + 0xd8))
               && ((nLevelMin <= (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc) ||
                   (*(int *)((long)plVar6 + 0x1c) == 0)))) {
              uVar2 = vMffc->nSize;
              if ((int)uVar2 < nMffcMax) {
                if (0 < (int)uVar2) {
                  uVar13 = 0;
                  do {
                    if (vMffc->pArray[uVar13] == (int)plVar6[2]) goto LAB_004ba5de;
                    uVar13 = uVar13 + 1;
                  } while (uVar2 != uVar13);
                }
                Vec_IntPush(vMffc,(int)plVar6[2]);
                uVar13 = extraout_RDX_20;
              }
            }
          }
LAB_004ba5de:
          lVar17 = lVar17 + 1;
          iVar11 = (pPivot->vFanins).nSize;
        } while (lVar17 < iVar11);
        if (0 < iVar11) {
          lVar17 = 0;
          do {
            plVar6 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
            if (((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) &&
               (*(int *)((long)plVar6 + 0x2c) == 1)) {
              lVar14 = *plVar6;
              iVar11 = (int)plVar6[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar11 + 1,(int)uVar13);
              if (((long)iVar11 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar11)) goto LAB_004bab9c;
              uVar13 = extraout_RDX_21;
              if ((*(int *)(*(long *)(lVar14 + 0xe8) + (long)iVar11 * 4) == *(int *)(*plVar6 + 0xd8)
                  ) && ((((nLevelMin <= (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc) ||
                          (*(int *)((long)plVar6 + 0x1c) == 0)) && (vMffc->nSize < nMffcMax)) &&
                        (0 < *(int *)((long)plVar6 + 0x1c))))) {
                lVar14 = 0;
                do {
                  plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                     (long)*(int *)(plVar6[4] + lVar14 * 4) * 8);
                  if (((*(uint *)((long)plVar7 + 0x14) & 0xf) == 7) &&
                     (*(int *)((long)plVar7 + 0x2c) == 1)) {
                    lVar18 = *plVar7;
                    iVar11 = (int)plVar7[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),iVar11 + 1,(int)uVar13);
                    if (((long)iVar11 < 0) || (*(int *)(lVar18 + 0xe4) <= iVar11))
                    goto LAB_004bab9c;
                    uVar13 = extraout_RDX_22;
                    if ((*(int *)(*(long *)(lVar18 + 0xe8) + (long)iVar11 * 4) ==
                         *(int *)(*plVar7 + 0xd8)) &&
                       ((nLevelMin <= (int)(*(uint *)((long)plVar7 + 0x14) >> 0xc) ||
                        (*(int *)((long)plVar7 + 0x1c) == 0)))) {
                      uVar2 = vMffc->nSize;
                      if ((int)uVar2 < nMffcMax) {
                        if (0 < (int)uVar2) {
                          uVar13 = 0;
                          do {
                            if (vMffc->pArray[uVar13] == (int)plVar7[2]) goto LAB_004ba76f;
                            uVar13 = uVar13 + 1;
                          } while (uVar2 != uVar13);
                        }
                        Vec_IntPush(vMffc,(int)plVar7[2]);
                        uVar13 = extraout_RDX_23;
                      }
                    }
                  }
LAB_004ba76f:
                  lVar14 = lVar14 + 1;
                } while (lVar14 < *(int *)((long)plVar6 + 0x1c));
              }
            }
            lVar17 = lVar17 + 1;
            iVar11 = (pPivot->vFanins).nSize;
          } while (lVar17 < iVar11);
          if (0 < iVar11) {
            lVar17 = 0;
            do {
              plVar6 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
              if (((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) &&
                 (*(int *)((long)plVar6 + 0x2c) == 1)) {
                lVar14 = *plVar6;
                iVar11 = (int)plVar6[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar11 + 1,(int)uVar13);
                if (((long)iVar11 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar11)) goto LAB_004bab9c;
                uVar13 = extraout_RDX_24;
                if ((*(int *)(*(long *)(lVar14 + 0xe8) + (long)iVar11 * 4) ==
                     *(int *)(*plVar6 + 0xd8)) &&
                   ((((nLevelMin <= (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc) ||
                      (*(int *)((long)plVar6 + 0x1c) == 0)) && (vMffc->nSize < nMffcMax)) &&
                    (0 < *(int *)((long)plVar6 + 0x1c))))) {
                  lVar14 = 0;
                  do {
                    plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                       (long)*(int *)(plVar6[4] + lVar14 * 4) * 8);
                    if (((*(uint *)((long)plVar7 + 0x14) & 0xf) == 7) &&
                       (*(int *)((long)plVar7 + 0x2c) == 1)) {
                      lVar18 = *plVar7;
                      iVar11 = (int)plVar7[2];
                      Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),iVar11 + 1,(int)uVar13);
                      if (((long)iVar11 < 0) || (*(int *)(lVar18 + 0xe4) <= iVar11))
                      goto LAB_004bab9c;
                      uVar13 = extraout_RDX_25;
                      if ((*(int *)(*(long *)(lVar18 + 0xe8) + (long)iVar11 * 4) ==
                           *(int *)(*plVar7 + 0xd8)) &&
                         (((nLevelMin <= (int)(*(uint *)((long)plVar7 + 0x14) >> 0xc) ||
                           (*(int *)((long)plVar7 + 0x1c) == 0)) &&
                          ((vMffc->nSize < nMffcMax && (0 < *(int *)((long)plVar7 + 0x1c))))))) {
                        lVar18 = 0;
                        do {
                          plVar8 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                             (long)*(int *)(plVar7[4] + lVar18 * 4) * 8);
                          if (((*(uint *)((long)plVar8 + 0x14) & 0xf) == 7) &&
                             (*(int *)((long)plVar8 + 0x2c) == 1)) {
                            lVar16 = *plVar8;
                            iVar11 = (int)plVar8[2];
                            Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar11 + 1,(int)uVar13);
                            if (((long)iVar11 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar11))
                            goto LAB_004bab9c;
                            uVar13 = extraout_RDX_26;
                            if ((*(int *)(*(long *)(lVar16 + 0xe8) + (long)iVar11 * 4) ==
                                 *(int *)(*plVar8 + 0xd8)) &&
                               ((nLevelMin <= (int)(*(uint *)((long)plVar8 + 0x14) >> 0xc) ||
                                (*(int *)((long)plVar8 + 0x1c) == 0)))) {
                              uVar2 = vMffc->nSize;
                              if ((int)uVar2 < nMffcMax) {
                                if (0 < (int)uVar2) {
                                  uVar13 = 0;
                                  do {
                                    if (vMffc->pArray[uVar13] == (int)plVar8[2]) goto LAB_004ba9e1;
                                    uVar13 = uVar13 + 1;
                                  } while (uVar2 != uVar13);
                                }
                                Vec_IntPush(vMffc,(int)plVar8[2]);
                                uVar13 = extraout_RDX_27;
                              }
                            }
                          }
LAB_004ba9e1:
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < *(int *)((long)plVar7 + 0x1c));
                      }
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < *(int *)((long)plVar6 + 0x1c));
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (pPivot->vFanins).nSize);
          }
        }
      }
      iVar11 = vMffc->nSize;
      if (nMffcMax < iVar11) {
        __assert_fail("Vec_IntSize(vMffc) <= nMffcMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x5f2,
                      "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          iVar3 = vMffc->pArray[lVar17];
          if (((long)iVar3 < 0) || (pVVar9 = pPivot->pNtk->vObjs, pVVar9->nSize <= iVar3))
          goto LAB_004babbb;
          pvVar10 = pVVar9->pArray[iVar3];
          if (pvVar10 != (void *)0x0) {
            pbVar1 = (byte *)((long)pvVar10 + 0x40);
            *pbVar1 = *pbVar1 | 8;
            iVar11 = vMffc->nSize;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar11);
      }
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x10;
      vInMffc->nSize = 0;
      iVar11 = vMffc->nSize;
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          iVar3 = vMffc->pArray[lVar17];
          if (((long)iVar3 < 0) || (pVVar9 = pPivot->pNtk->vObjs, pVVar9->nSize <= iVar3)) {
LAB_004babbb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar15 = pVVar9->pArray;
          plVar6 = (long *)ppvVar15[iVar3];
          if ((plVar6 != (long *)0x0) && (0 < *(int *)((long)plVar6 + 0x1c))) {
            lVar14 = 0;
            do {
              plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                 (long)*(int *)(plVar6[4] + lVar14 * 4) * 8);
              lVar18 = *plVar7;
              iVar11 = (int)plVar7[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),iVar11 + 1,(int)ppvVar15);
              if (((long)iVar11 < 0) || (*(int *)(lVar18 + 0xe4) <= iVar11)) goto LAB_004bab9c;
              ppvVar15 = extraout_RDX_28;
              if ((*(int *)(*(long *)(lVar18 + 0xe8) + (long)iVar11 * 4) == *(int *)(*plVar7 + 0xd8)
                  ) && ((int)plVar7[8] == 1)) {
                if (0 < (long)vInMffc->nSize) {
                  ppvVar15 = (void **)0x0;
                  do {
                    if (vInMffc->pArray[(long)ppvVar15] == (int)plVar7[2]) goto LAB_004bab61;
                    ppvVar15 = (void **)((long)ppvVar15 + 1);
                  } while ((void **)(long)vInMffc->nSize != ppvVar15);
                }
                Vec_IntPush(vInMffc,(int)plVar7[2]);
                ppvVar15 = extraout_RDX_29;
              }
LAB_004bab61:
              lVar14 = lVar14 + 1;
            } while (lVar14 < *(int *)((long)plVar6 + 0x1c));
            iVar11 = vMffc->nSize;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar11);
      }
    }
    else {
      *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
      vInMffc->nSize = 0;
      if (0 < (pPivot->vFanins).nSize) {
        lVar17 = 0;
        do {
          pAVar4 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
          pAVar5 = pAVar4->pNtk;
          iVar11 = pAVar4->Id;
          Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)uVar13);
          if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11)) goto LAB_004bab9c;
          uVar13 = extraout_RDX_10;
          if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
             (iVar11 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar4), uVar13 = extraout_RDX_11,
             iVar11 != 0)) {
            if (0 < (long)vInMffc->nSize) {
              uVar13 = 0;
              do {
                if (vInMffc->pArray[uVar13] == pAVar4->Id) goto LAB_004ba2aa;
                uVar13 = uVar13 + 1;
              } while ((long)vInMffc->nSize != uVar13);
            }
            Vec_IntPush(vInMffc,pAVar4->Id);
            uVar13 = extraout_RDX_12;
          }
LAB_004ba2aa:
          lVar17 = lVar17 + 1;
          iVar11 = (pPivot->vFanins).nSize;
          uVar12 = (ulong)iVar11;
        } while (lVar17 < (long)uVar12);
        if (0 < iVar11) {
          lVar17 = 0;
          do {
            lVar14 = (long)(pPivot->vFanins).pArray[lVar17];
            plVar6 = (long *)pPivot->pNtk->vObjs->pArray[lVar14];
            if (0 < *(int *)((long)plVar6 + 0x1c)) {
              lVar18 = 0;
              do {
                pAVar4 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                          (long)*(int *)(plVar6[4] + lVar18 * 4) * 8);
                pAVar5 = pAVar4->pNtk;
                iVar11 = pAVar4->Id;
                Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)lVar14);
                if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11)) goto LAB_004bab9c;
                lVar14 = extraout_RDX_13;
                if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
                   (iVar11 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar4), lVar14 = extraout_RDX_14,
                   iVar11 != 0)) {
                  if (0 < (long)vInMffc->nSize) {
                    lVar14 = 0;
                    do {
                      if (vInMffc->pArray[lVar14] == pAVar4->Id) goto LAB_004ba390;
                      lVar14 = lVar14 + 1;
                    } while (vInMffc->nSize != lVar14);
                  }
                  Vec_IntPush(vInMffc,pAVar4->Id);
                  lVar14 = extraout_RDX_15;
                }
LAB_004ba390:
                lVar18 = lVar18 + 1;
              } while (lVar18 < *(int *)((long)plVar6 + 0x1c));
              uVar12 = (ulong)(uint)(pPivot->vFanins).nSize;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < (int)uVar12);
          if (0 < (int)uVar12) {
            lVar17 = 0;
            do {
              plVar6 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
              iVar11 = *(int *)((long)plVar6 + 0x1c);
              if (0 < iVar11) {
                lVar14 = 0;
                do {
                  lVar18 = (long)*(int *)(plVar6[4] + lVar14 * 4);
                  plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + lVar18 * 8);
                  if (0 < *(int *)((long)plVar7 + 0x1c)) {
                    lVar16 = 0;
                    do {
                      pAVar4 = *(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                (long)*(int *)(plVar7[4] + lVar16 * 4) * 8);
                      pAVar5 = pAVar4->pNtk;
                      iVar11 = pAVar4->Id;
                      Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)lVar18);
                      if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11))
                      goto LAB_004bab9c;
                      lVar18 = extraout_RDX_16;
                      if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
                         (iVar11 = Sfm_TimNodeIsNonCritical(pTim,pPivot,pAVar4),
                         lVar18 = extraout_RDX_17, iVar11 != 0)) {
                        if (0 < (long)vInMffc->nSize) {
                          lVar18 = 0;
                          do {
                            if (vInMffc->pArray[lVar18] == pAVar4->Id) goto LAB_004ba4b9;
                            lVar18 = lVar18 + 1;
                          } while (vInMffc->nSize != lVar18);
                        }
                        Vec_IntPush(vInMffc,pAVar4->Id);
                        lVar18 = extraout_RDX_18;
                      }
LAB_004ba4b9:
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < *(int *)((long)plVar7 + 0x1c));
                    iVar11 = *(int *)((long)plVar6 + 0x1c);
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 < iVar11);
                uVar12 = (ulong)(uint)(pPivot->vFanins).nSize;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)uVar12);
          }
        }
      }
    }
  }
  else {
    *(byte *)&pPivot->field_6 = *(byte *)&pPivot->field_6 | 0x18;
    vInMffc->nSize = 0;
    if (0 < (pPivot->vFanins).nSize) {
      lVar17 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
        pAVar5 = pAVar4->pNtk;
        iVar11 = pAVar4->Id;
        Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)uVar13);
        if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11)) {
LAB_004bab9c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = extraout_RDX_01;
        if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
           (iVar11 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar4), uVar13 = extraout_RDX_02,
           iVar11 != 0)) {
          if (0 < (long)vInMffc->nSize) {
            uVar13 = 0;
            do {
              if (vInMffc->pArray[uVar13] == pAVar4->Id) goto LAB_004b9f80;
              uVar13 = uVar13 + 1;
            } while ((long)vInMffc->nSize != uVar13);
          }
          Vec_IntPush(vInMffc,pAVar4->Id);
          uVar13 = extraout_RDX_03;
        }
LAB_004b9f80:
        lVar17 = lVar17 + 1;
        iVar11 = (pPivot->vFanins).nSize;
        uVar12 = (ulong)iVar11;
      } while (lVar17 < (long)uVar12);
      if (0 < iVar11) {
        lVar17 = 0;
        do {
          lVar14 = (long)(pPivot->vFanins).pArray[lVar17];
          plVar6 = (long *)pPivot->pNtk->vObjs->pArray[lVar14];
          if (0 < *(int *)((long)plVar6 + 0x1c)) {
            lVar18 = 0;
            do {
              pAVar4 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                        (long)*(int *)(plVar6[4] + lVar18 * 4) * 8);
              pAVar5 = pAVar4->pNtk;
              iVar11 = pAVar4->Id;
              Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)lVar14);
              if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11)) goto LAB_004bab9c;
              lVar14 = extraout_RDX_04;
              if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
                 (iVar11 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar4), lVar14 = extraout_RDX_05,
                 iVar11 != 0)) {
                if (0 < (long)vInMffc->nSize) {
                  lVar14 = 0;
                  do {
                    if (vInMffc->pArray[lVar14] == pAVar4->Id) goto LAB_004ba065;
                    lVar14 = lVar14 + 1;
                  } while (vInMffc->nSize != lVar14);
                }
                Vec_IntPush(vInMffc,pAVar4->Id);
                lVar14 = extraout_RDX_06;
              }
LAB_004ba065:
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar6 + 0x1c));
            uVar12 = (ulong)(uint)(pPivot->vFanins).nSize;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (int)uVar12);
        if (0 < (int)uVar12) {
          lVar17 = 0;
          do {
            plVar6 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar17]];
            iVar11 = *(int *)((long)plVar6 + 0x1c);
            if (0 < iVar11) {
              lVar14 = 0;
              do {
                lVar18 = (long)*(int *)(plVar6[4] + lVar14 * 4);
                plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + lVar18 * 8);
                if (0 < *(int *)((long)plVar7 + 0x1c)) {
                  lVar16 = 0;
                  do {
                    pAVar4 = *(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                              (long)*(int *)(plVar7[4] + lVar16 * 4) * 8);
                    pAVar5 = pAVar4->pNtk;
                    iVar11 = pAVar4->Id;
                    Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,(int)lVar18);
                    if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11))
                    goto LAB_004bab9c;
                    lVar18 = extraout_RDX_07;
                    if (((pAVar5->vTravIds).pArray[iVar11] == pAVar4->pNtk->nTravIds) &&
                       (iVar11 = Sfm_MitNodeIsNonCritical(pMit,pPivot,pAVar4),
                       lVar18 = extraout_RDX_08, iVar11 != 0)) {
                      if (0 < (long)vInMffc->nSize) {
                        lVar18 = 0;
                        do {
                          if (vInMffc->pArray[lVar18] == pAVar4->Id) goto LAB_004ba18e;
                          lVar18 = lVar18 + 1;
                        } while (vInMffc->nSize != lVar18);
                      }
                      Vec_IntPush(vInMffc,pAVar4->Id);
                      lVar18 = extraout_RDX_09;
                    }
LAB_004ba18e:
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < *(int *)((long)plVar7 + 0x1c));
                  iVar11 = *(int *)((long)plVar6 + 0x1c);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < iVar11);
              uVar12 = (ulong)(uint)(pPivot->vFanins).nSize;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < (int)uVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void Sfm_DecMarkMffc( Abc_Obj_t * pPivot, int nLevelMin, int nMffcMax, int fVeryVerbose, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFanin3, * pObj; int i, k, n;
    assert( nMffcMax > 0 );
    Vec_IntFill( vMffc, 1, Abc_ObjId(pPivot) );
    if ( pMit != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput2(pFanin, nLevelMin, pMit, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput2(pFanin2, nLevelMin, pMit, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput2(pFanin3, nLevelMin, pMit, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );
    }
    else if ( pTim != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput(pFanin, nLevelMin, pTim, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput(pFanin2, nLevelMin, pTim, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput(pFanin3, nLevelMin, pTim, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );

/*
        printf( "Node %d: (%.2f)  ", pPivot->Id, MIO_NUMINV*Sfm_ManReadObjDelay(p, Abc_ObjId(pPivot))  );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pFanin), MIO_NUMINV*Sfm_ManReadObjDelay(p, Abc_ObjId(pFanin)) );
        printf( "\n" );

        printf( "Node %d: ", pPivot->Id );
        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pObj), MIO_NUMINV*Sfm_ManReadObjDelay(p, Abc_ObjId(pObj)) );
        printf( "\n" );
*/
    }
    else
    {

        // collect MFFC
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                            if ( Sfm_DecNodeIsMffc(pFanin3, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin3) );
        // mark MFFC
        assert( Vec_IntSize(vMffc) <= nMffcMax );
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            pObj->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs
        Vec_IntClear(vInMffc);
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( Abc_NodeIsTravIdCurrent(pFanin) && pFanin->iTemp == SFM_MASK_PI )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );

//        printf( "Node %d: ", pPivot->Id );
//        Abc_ObjForEachFanin( pPivot, pFanin, i )
//            printf( "%d ", Abc_ObjFanoutNum(pFanin) );
//        printf( "\n" );

//        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
//            printf( "%d ", Abc_ObjFanoutNum(pObj) );
//        printf( "\n" );

    }
}